

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O2

optional<unsigned_int> __thiscall
slang::ast::ConditionalExpression::getEffectiveWidthImpl(ConditionalExpression *this)

{
  Expression *this_00;
  optional<unsigned_int> oVar1;
  optional<unsigned_int> *poVar2;
  Expression *this_01;
  _Optional_base<unsigned_int,_true,_true> local_20;
  _Optional_payload_base<unsigned_int> local_18;
  
  if (this->isConst == false) {
    this_01 = this->left_;
  }
  else {
    this_01 = this->left_;
    this_00 = this_01;
    if (this->isTrue == false) {
      this_00 = this->right_;
    }
    if (this_00 != (Expression *)0x0) {
      oVar1 = Expression::getEffectiveWidth(this_00);
      return (optional<unsigned_int>)
             oVar1.super__Optional_base<unsigned_int,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_int>;
    }
  }
  local_18 = (_Optional_payload_base<unsigned_int>)Expression::getEffectiveWidth(this_01);
  local_20._M_payload.super__Optional_payload_base<unsigned_int> =
       (_Optional_payload<unsigned_int,_true,_true,_true>)
       Expression::getEffectiveWidth(this->right_);
  poVar2 = std::max<std::optional<unsigned_int>>
                     ((optional<unsigned_int> *)&local_18,(optional<unsigned_int> *)&local_20);
  return (optional<unsigned_int>)
         (poVar2->super__Optional_base<unsigned_int,_true,_true>)._M_payload.
         super__Optional_payload_base<unsigned_int>;
}

Assistant:

std::optional<bitwidth_t> ConditionalExpression::getEffectiveWidthImpl() const {
    if (auto branch = knownSide())
        return branch->getEffectiveWidth();
    return std::max(left().getEffectiveWidth(), right().getEffectiveWidth());
}